

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

void __thiscall OpenMD::PositiveConstraint::PositiveConstraint(PositiveConstraint *this)

{
  (this->super_ParamConstraintFacade<OpenMD::PositiveConstraint>).description_._M_dataplus._M_p =
       (pointer)&(this->super_ParamConstraintFacade<OpenMD::PositiveConstraint>).description_.
                 field_2;
  (this->super_ParamConstraintFacade<OpenMD::PositiveConstraint>).description_._M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::PositiveConstraint>).description_.field_2._M_local_buf
  [0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x2927ed);
  return;
}

Assistant:

PositiveConstraint() { this->description_ = "positive"; }